

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleSemantic
          (HlslParseContext *this,TSourceLoc loc,TQualifier *qualifier,TBuiltInVariable builtIn,
          TString *upperCase)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  char *pcVar5;
  uint local_50;
  uint local_4c;
  undefined1 local_48 [8];
  anon_class_32_2_633b926d getSemanticNumber;
  TString *upperCase_local;
  TBuiltInVariable builtIn_local;
  TQualifier *qualifier_local;
  HlslParseContext *this_local;
  
  getSemanticNumber.this = (HlslParseContext *)loc.name;
  getSemanticNumber.loc.name = (TString *)loc._8_8_;
  getSemanticNumber.loc.string = loc.column;
  getSemanticNumber.loc.line = loc._20_4_;
  local_48 = (undefined1  [8])this;
  getSemanticNumber.loc._16_8_ = upperCase;
  upperCase_local._4_4_ = builtIn;
  if ((builtIn == EbvNone) &&
     (bVar1 = TParseVersions::hlslDX9Compatible((TParseVersions *)this), bVar1)) {
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex) {
      bVar1 = TQualifier::isParamOutput(qualifier);
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)getSemanticNumber.loc._16_8_,"POSITION");
        if (bVar1) {
          upperCase_local._4_4_ = EbvPosition;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)getSemanticNumber.loc._16_8_,"PSIZE");
        if (bVar1) {
          upperCase_local._4_4_ = EbvPointSize;
        }
      }
    }
    else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
      bVar1 = TQualifier::isParamInput(qualifier);
      if ((bVar1) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)getSemanticNumber.loc._16_8_,"VPOS"), bVar1)) {
        upperCase_local._4_4_ = EbvFragCoord;
      }
      bVar1 = TQualifier::isParamOutput(qualifier);
      if (bVar1) {
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)getSemanticNumber.loc._16_8_,0,5,"COLOR");
        if (iVar2 == 0) {
          uVar3 = handleSemantic::anon_class_32_2_633b926d::operator()
                            ((anon_class_32_2_633b926d *)local_48,
                             (TString *)getSemanticNumber.loc._16_8_,0,(char *)0x0);
          *(ulong *)&qualifier->field_0x1c =
               *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar3 & 0xfff;
          local_4c = ((uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff) + 1;
          puVar4 = std::max<unsigned_int>(&this->nextOutLocation,&local_4c);
          this->nextOutLocation = *puVar4;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)getSemanticNumber.loc._16_8_,"DEPTH");
        if (bVar1) {
          upperCase_local._4_4_ = EbvFragDepth;
        }
      }
    }
  }
  if (upperCase_local._4_4_ == EbvNone) {
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) &&
       (iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)getSemanticNumber.loc._16_8_,0,9,"SV_TARGET"), iVar2 == 0)) {
      uVar3 = handleSemantic::anon_class_32_2_633b926d::operator()
                        ((anon_class_32_2_633b926d *)local_48,
                         (TString *)getSemanticNumber.loc._16_8_,0,(char *)0x0);
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar3 & 0xfff;
      local_50 = ((uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff) + 1;
      puVar4 = std::max<unsigned_int>(&this->nextOutLocation,&local_50);
      this->nextOutLocation = *puVar4;
    }
    else {
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)getSemanticNumber.loc._16_8_,0,0xf,"SV_CLIPDISTANCE");
      if (iVar2 == 0) {
        upperCase_local._4_4_ = EbvClipDistance;
        uVar3 = handleSemantic::anon_class_32_2_633b926d::operator()
                          ((anon_class_32_2_633b926d *)local_48,
                           (TString *)getSemanticNumber.loc._16_8_,2,"invalid clip semantic");
        *(ulong *)&qualifier->field_0x1c =
             *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar3 & 0xfff;
      }
      else {
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)getSemanticNumber.loc._16_8_,0,0xf,"SV_CULLDISTANCE");
        if (iVar2 == 0) {
          upperCase_local._4_4_ = EbvCullDistance;
          uVar3 = handleSemantic::anon_class_32_2_633b926d::operator()
                            ((anon_class_32_2_633b926d *)local_48,
                             (TString *)getSemanticNumber.loc._16_8_,2,"invalid cull semantic");
          *(ulong *)&qualifier->field_0x1c =
               *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar3 & 0xfff;
        }
      }
    }
  }
  else if (upperCase_local._4_4_ == EbvPosition) {
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
      upperCase_local._4_4_ = EbvFragCoord;
    }
  }
  else if (upperCase_local._4_4_ - EbvTessLevelOuter < 2) {
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 & 0xffffefffffffffff | 0x100000000000;
  }
  else if (upperCase_local._4_4_ == EbvFragStencilRef) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,&loc,"unimplemented; need ARB_shader_stencil_export","SV_STENCILREF","");
  }
  if ((*(ulong *)&qualifier->field_0x8 >> 7 & 0x1ff) == 0) {
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f |
         ((ulong)upperCase_local._4_4_ & 0x1ff) << 7;
  }
  pcVar5 = TIntermediate::addSemanticName
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      (TString *)getSemanticNumber.loc._16_8_);
  qualifier->semanticName = pcVar5;
  return;
}

Assistant:

void HlslParseContext::handleSemantic(TSourceLoc loc, TQualifier& qualifier, TBuiltInVariable builtIn,
                                      const TString& upperCase)
{
    // Parse and return semantic number.  If limit is 0, it will be ignored.  Otherwise, if the parsed
    // semantic number is >= limit, errorMsg is issued and 0 is returned.
    // TODO: it would be nicer if limit and errorMsg had default parameters, but some compilers don't yet
    // accept those in lambda functions.
    const auto getSemanticNumber = [this, loc](const TString& semantic, unsigned int limit, const char* errorMsg) -> unsigned int {
        size_t pos = semantic.find_last_not_of("0123456789");
        if (pos == std::string::npos)
            return 0u;

        unsigned int semanticNum = (unsigned int)atoi(semantic.c_str() + pos + 1);

        if (limit != 0 && semanticNum >= limit) {
            error(loc, errorMsg, semantic.c_str(), "");
            return 0u;
        }

        return semanticNum;
    };

    if (builtIn == EbvNone && hlslDX9Compatible()) {
        if (language == EShLangVertex) {
            if (qualifier.isParamOutput()) {
                if (upperCase == "POSITION") {
                    builtIn = EbvPosition;
                }
                if (upperCase == "PSIZE") {
                    builtIn = EbvPointSize;
                }
            }
        } else if (language == EShLangFragment) {
            if (qualifier.isParamInput() && upperCase == "VPOS") {
                builtIn = EbvFragCoord;
            }
            if (qualifier.isParamOutput()) {
                if (upperCase.compare(0, 5, "COLOR") == 0) {
                    qualifier.layoutLocation = getSemanticNumber(upperCase, 0, nullptr);
                    nextOutLocation = std::max(nextOutLocation, qualifier.layoutLocation + 1u);
                }
                if (upperCase == "DEPTH") {
                    builtIn = EbvFragDepth;
                }
            }
        }
    }

    switch(builtIn) {
    case EbvNone:
        // Get location numbers from fragment outputs, instead of
        // auto-assigning them.
        if (language == EShLangFragment && upperCase.compare(0, 9, "SV_TARGET") == 0) {
            qualifier.layoutLocation = getSemanticNumber(upperCase, 0, nullptr);
            nextOutLocation = std::max(nextOutLocation, qualifier.layoutLocation + 1u);
        } else if (upperCase.compare(0, 15, "SV_CLIPDISTANCE") == 0) {
            builtIn = EbvClipDistance;
            qualifier.layoutLocation = getSemanticNumber(upperCase, maxClipCullRegs, "invalid clip semantic");
        } else if (upperCase.compare(0, 15, "SV_CULLDISTANCE") == 0) {
            builtIn = EbvCullDistance;
            qualifier.layoutLocation = getSemanticNumber(upperCase, maxClipCullRegs, "invalid cull semantic");
        }
        break;
    case EbvPosition:
        // adjust for stage in/out
        if (language == EShLangFragment)
            builtIn = EbvFragCoord;
        break;
    case EbvFragStencilRef:
        error(loc, "unimplemented; need ARB_shader_stencil_export", "SV_STENCILREF", "");
        break;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        qualifier.patch = true;
        break;
    default:
        break;
    }

    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = builtIn;
    qualifier.semanticName = intermediate.addSemanticName(upperCase);
}